

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall
Clasp::SharedContext::setConfiguration(SharedContext *this,Configuration *c,Type ownership)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  uint uVar5;
  Configuration *pCVar6;
  undefined4 extraout_var;
  SatPreprocessor *pSVar7;
  int in_EDX;
  Configuration *in_RSI;
  SharedContext *in_RDI;
  bool bVar8;
  Subsystem in_stack_0000000c;
  SharedContext *in_stack_00000010;
  uint32 i;
  ContextParams *opts;
  bool own;
  undefined4 in_stack_ffffffffffffffc8;
  uint32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  size_type sVar9;
  size_type n;
  bool local_15;
  Configuration *local_10;
  Solver *this_00;
  
  bVar8 = in_EDX == 1;
  local_10 = in_RSI;
  if (in_RSI == (Configuration *)0x0) {
    local_10 = (Configuration *)config_def_s;
  }
  bVar1 = in_RSI != (Configuration *)0x0;
  local_15 = bVar1 && bVar8;
  report(in_stack_00000010,in_stack_0000000c);
  pCVar6 = SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)0x1d4950);
  if (pCVar6 == local_10) {
    uVar5 = (uint)local_15;
    bVar2 = SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::is_owner
                      ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)0x1d4ae7);
    if (uVar5 != bVar2) {
      if (bVar1 && bVar8) {
        SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::acquire
                  ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)in_RDI);
      }
      else {
        SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::release
                  ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)in_RDI);
      }
    }
  }
  else {
    SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::operator=
              ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)in_RDI,
               (Configuration *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (!bVar1 || !bVar8) {
      SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::release
                ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)in_RDI);
    }
    pCVar6 = SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)0x1d499a);
    (*pCVar6->_vptr_Configuration[2])(pCVar6,in_RDI);
    pCVar6 = SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)0x1d49b9);
    iVar3 = (*pCVar6->_vptr_Configuration[3])();
    this_00 = (Solver *)CONCAT44(extraout_var,iVar3);
    setShareMode(in_RDI,(uint)(*(byte *)&(this_00->model).ebo_.buf & 7));
    setShortMode(in_RDI,(uint)(*(byte *)&(this_00->model).ebo_.buf >> 5 & 1));
    in_RDI->share_ =
         (Share)((uint)in_RDI->share_ & 0xfbffffff |
                (uint)(*(byte *)&(this_00->model).ebo_.buf >> 6 & 1) << 0x1a);
    pSVar7 = SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject> *)0x1d4a2b);
    if ((pSVar7 == (SatPreprocessor *)0x0) &&
       (((undefined1  [528])*this_00 & (undefined1  [528])0x3) != (undefined1  [528])0x0)) {
      SatPreParams::create
                ((SatPreParams *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject>::reset
                ((SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject> *)this_00,
                 (SatPreprocessor *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    enableStats(in_RDI,in_stack_ffffffffffffffcc);
    sVar9 = 0;
    while (n = sVar9,
          sVar4 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::size
                            (&in_RDI->solvers_), sVar9 != sVar4) {
      bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::operator[]
                (&in_RDI->solvers_,n);
      Solver::resetConfig(this_00);
      sVar9 = n + 1;
    }
  }
  return;
}

Assistant:

void SharedContext::setConfiguration(Configuration* c, Ownership_t::Type ownership) {
	bool own = ownership == Ownership_t::Acquire;
	if (c == 0) { c = &config_def_s; own = false; }
	report(Event::subsystem_facade);
	if (config_.get() != c) {
		config_ = c;
		if (!own) config_.release();
		config_->prepare(*this);
		const ContextParams& opts = config_->context();
		setShareMode(static_cast<ContextParams::ShareMode>(opts.shareMode));
		setShortMode(static_cast<ContextParams::ShortMode>(opts.shortMode));
		share_.seed   = opts.seed;
		if (satPrepro.get() == 0 && opts.satPre.type != SatPreParams::sat_pre_no) {
			satPrepro.reset(SatPreParams::create(opts.satPre));
		}
		enableStats(opts.stats);
		// force update on next call to Solver::startInit()
		for (uint32 i = 0; i != solvers_.size(); ++i) {
			solvers_[i]->resetConfig();
		}
	}
	else if (own != config_.is_owner()) {
		if (own) config_.acquire();
		else     config_.release();
	}
}